

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void __thiscall
cmTargetCollectLinkLanguages::Visit(cmTargetCollectLinkLanguages *this,cmLinkItem *item)

{
  cmTarget *pcVar1;
  bool bVar2;
  PolicyStatus PVar3;
  cmLinkInterface *pcVar4;
  long lVar5;
  ostream *poVar6;
  cmake *this_00;
  cmListFileBacktrace *r;
  PolicyID id;
  MessageType t;
  pointer pbVar7;
  pointer item_00;
  pair<std::_Rb_tree_iterator<const_cmGeneratorTarget_*>,_bool> pVar8;
  ostringstream e;
  string local_1e0;
  cmListFileBacktrace local_1c0;
  undefined1 local_1a0 [376];
  
  if (item->Target == (cmGeneratorTarget *)0x0) {
    lVar5 = std::__cxx11::string::find((char *)item,0x55c14e,0);
    if (lVar5 != -1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      PVar3 = cmLocalGenerator::GetPolicyStatus(this->Target->LocalGenerator,CMP0028);
      t = FATAL_ERROR;
      if (PVar3 == OLD) {
        bVar2 = true;
      }
      else {
        t = FATAL_ERROR;
        if (PVar3 == WARN) {
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1e0,(cmPolicies *)0x1c,id);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a0,local_1e0._M_dataplus._M_p,
                              local_1e0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
            operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
          }
          t = AUTHOR_WARNING;
        }
        bVar2 = false;
      }
      if (!bVar2) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Target \"",8);
        pcVar1 = this->Target->Target;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a0,(pcVar1->Name)._M_dataplus._M_p,
                            (pcVar1->Name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" links to target \"",0x13);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(item->super_string)._M_dataplus._M_p,
                            (item->super_string)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,
                   "\" but the target was not found.  Perhaps a find_package() call is missing for an IMPORTED target, or an ALIAS target is missing?"
                   ,0x80);
        this_00 = cmLocalGenerator::GetCMakeInstance(this->Target->LocalGenerator);
        std::__cxx11::stringbuf::str();
        r = cmTarget::GetBacktrace(this->Target->Target);
        cmListFileBacktrace::cmListFileBacktrace(&local_1c0,r);
        cmake::IssueMessage(this_00,t,&local_1e0,&local_1c0);
        cmListFileBacktrace::~cmListFileBacktrace(&local_1c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
      std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
    }
  }
  else {
    pVar8 = std::
            _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
            ::_M_insert_unique<cmGeneratorTarget_const*const&>
                      ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                        *)&this->Visited,&item->Target);
    if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pcVar4 = cmGeneratorTarget::GetLinkInterface(item->Target,&this->Config,this->HeadTarget);
      if (pcVar4 != (cmLinkInterface *)0x0) {
        pbVar7 = (pcVar4->Languages).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (pbVar7 != (pcVar4->Languages).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
          do {
            local_1a0._0_8_ = this->Languages;
            std::
            _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                      ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)local_1a0._0_8_,pbVar7,local_1a0);
            pbVar7 = pbVar7 + 1;
          } while (pbVar7 != (pcVar4->Languages).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
        }
        for (item_00 = (pcVar4->super_cmLinkInterfaceLibraries).Libraries.
                       super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                       super__Vector_impl_data._M_start;
            item_00 !=
            (pcVar4->super_cmLinkInterfaceLibraries).Libraries.
            super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
            super__Vector_impl_data._M_finish; item_00 = item_00 + 1) {
          Visit(this,item_00);
        }
      }
    }
  }
  return;
}

Assistant:

void Visit(cmLinkItem const& item)
  {
    if (!item.Target) {
      if (item.find("::") != std::string::npos) {
        bool noMessage = false;
        cmake::MessageType messageType = cmake::FATAL_ERROR;
        std::ostringstream e;
        switch (this->Target->GetLocalGenerator()->GetPolicyStatus(
          cmPolicies::CMP0028)) {
          case cmPolicies::WARN: {
            e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0028) << "\n";
            messageType = cmake::AUTHOR_WARNING;
          } break;
          case cmPolicies::OLD:
            noMessage = true;
          case cmPolicies::REQUIRED_IF_USED:
          case cmPolicies::REQUIRED_ALWAYS:
          case cmPolicies::NEW:
            // Issue the fatal message.
            break;
        }

        if (!noMessage) {
          e << "Target \"" << this->Target->GetName()
            << "\" links to target \"" << item
            << "\" but the target was not found.  Perhaps a find_package() "
               "call is missing for an IMPORTED target, or an ALIAS target is "
               "missing?";
          this->Target->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(
            messageType, e.str(), this->Target->GetBacktrace());
        }
      }
      return;
    }
    if (!this->Visited.insert(item.Target).second) {
      return;
    }
    cmLinkInterface const* iface =
      item.Target->GetLinkInterface(this->Config, this->HeadTarget);
    if (!iface) {
      return;
    }

    for (std::vector<std::string>::const_iterator li =
           iface->Languages.begin();
         li != iface->Languages.end(); ++li) {
      this->Languages.insert(*li);
    }

    for (std::vector<cmLinkItem>::const_iterator li = iface->Libraries.begin();
         li != iface->Libraries.end(); ++li) {
      this->Visit(*li);
    }
  }